

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfunction.h
# Opt level: O0

void __thiscall
TPZFunction<std::complex<double>_>::Print(TPZFunction<std::complex<double>_> *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  ostream *in_RSI;
  long *in_RDI;
  
  poVar2 = std::operator<<(in_RSI,
                           "virtual void TPZFunction<std::complex<double>>::Print(std::ostream &) [T = std::complex<double>]"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RSI,"Polynomial Order = ");
  iVar1 = (**(code **)(*in_RDI + 0x68))();
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void Print(std::ostream &out)
    {
        out << __PRETTY_FUNCTION__ << std::endl;
        out << "Polynomial Order = " << PolynomialOrder() << std::endl;
    }